

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O2

MPP_RET allocator_ion_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  int iVar1;
  uint __fd;
  RK_S32 RVar2;
  MPP_RET MVar3;
  size_t *psVar4;
  FILE *__stream;
  size_t sVar5;
  size_t extraout_RDX;
  size_t max_length;
  size_t extraout_RDX_00;
  size_t max_length_00;
  size_t extraout_RDX_01;
  char *pcVar6;
  long lVar7;
  int local_13c;
  char path [256];
  
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,"mpp_ion","os_allocator_open Android do not accept NULL input\n",(char *)0x0);
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (void *)0x0;
    __fd = open64("/dev/ion",0x80002);
    if ((int)__fd < 0) {
      _mpp_log_l(2,"mpp_ion","open %s failed!\n",(char *)0x0,"/dev/ion");
      MVar3 = MPP_ERR_UNKNOW;
    }
    else {
      if (((byte)ion_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_ion","open ion dev fd %d\n",(char *)0x0,(ulong)__fd);
      }
      psVar4 = (size_t *)mpp_osal_malloc("allocator_ion_open",0x10);
      if (psVar4 == (size_t *)0x0) {
        close(__fd);
        _mpp_log_l(2,"mpp_ion","os_allocator_open Android failed to allocate context\n",(char *)0x0)
        ;
        MVar3 = MPP_ERR_MALLOC;
      }
      else {
        pthread_mutex_lock((pthread_mutex_t *)&lock);
        if (ion_heap_id < 0) {
          mpp_env_get_u32("ion_debug",&ion_debug,0);
          max_length_00 = extraout_RDX;
          for (lVar7 = 0; lVar7 != 0x28; lVar7 = lVar7 + 8) {
            builtin_strncpy(path,"/proc/device-tree",0x12);
            pcVar6 = *(char **)((long)&check_sysfs_iommu_dts_devices + lVar7);
            RVar2 = find_dir_in_path(path,pcVar6,max_length_00);
            max_length_00 = max_length;
            if ((RVar2 != 0) &&
               (RVar2 = find_dir_in_path(path,"iommu_enabled",max_length),
               max_length_00 = extraout_RDX_00, RVar2 != 0)) {
              __stream = fopen64(path,"rb");
              if (__stream != (FILE *)0x0) {
                local_13c = 0;
                sVar5 = fread(&local_13c,4,1,__stream);
                iVar1 = local_13c;
                if (sVar5 != 0) {
                  _mpp_log_l(4,"mpp_ion","%s iommu_enabled %d\n",(char *)0x0,pcVar6,
                             (ulong)(local_13c != 0));
                }
                fclose(__stream);
                if (iVar1 != 0) goto LAB_0011ca7b;
              }
              ion_heap_mask = 0x10;
              pcVar6 = "ION_HEAP_TYPE_DMA";
              RVar2 = 4;
              goto LAB_0011caf2;
            }
          }
          lVar7 = 0;
          do {
            if (lVar7 == 0x10) {
              RVar2 = 2;
              _mpp_log_l(2,"mpp_ion","can not find any hint from all possible devices\n",(char *)0x0
                        );
              pcVar6 = "ION_HEAP_TYPE_CARVEOUT";
              ion_heap_mask = 4;
              goto LAB_0011caf2;
            }
            builtin_strncpy(path + 0x10,"g/ion/heaps",0xc);
            builtin_strncpy(path,"/sys/kernel/debu",0x10);
            pcVar6 = *(char **)((long)&check_sysfs_iommu_system_heaps + lVar7);
            RVar2 = find_dir_in_path(path,pcVar6,max_length_00);
            lVar7 = lVar7 + 8;
            max_length_00 = extraout_RDX_01;
          } while (RVar2 == 0);
          _mpp_log_l(4,"mpp_ion","%s found\n",(char *)0x0,pcVar6);
LAB_0011ca7b:
          pcVar6 = "ION_HEAP_TYPE_SYSTEM";
          RVar2 = 0;
          ion_heap_mask = 1;
LAB_0011caf2:
          ion_heap_id = RVar2;
          _mpp_log_l(4,"mpp_ion","using ion heap %s\n",(char *)0x0,pcVar6);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&lock);
        *psVar4 = alignment;
        *(MppAllocFlagType *)((long)psVar4 + 0xc) = flags;
        *(uint *)(psVar4 + 1) = __fd;
        *ctx = psVar4;
        MVar3 = MPP_OK;
      }
    }
  }
  return MVar3;
}

Assistant:

static MPP_RET allocator_ion_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    RK_S32 fd;
    allocator_ctx_ion *p;

    if (NULL == ctx) {
        mpp_err("os_allocator_open Android do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;

    fd = open(dev_ion, O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open %s failed!\n", dev_ion);
        return MPP_ERR_UNKNOW;
    }

    ion_dbg(ION_DEVICE, "open ion dev fd %d\n", fd);

    p = mpp_malloc(allocator_ctx_ion, 1);
    if (NULL == p) {
        close(fd);
        mpp_err("os_allocator_open Android failed to allocate context\n");
        return MPP_ERR_MALLOC;
    } else {
        /*
         * do heap id detection here:
         * if there is no vpu_service use default ION_HEAP_TYPE_SYSTEM_CONTIG
         * if there is vpu_service then check the iommu_enable status
         */
        pthread_mutex_lock(&lock);
        if (ion_heap_id < 0) {
            int detect_result = check_sysfs_iommu();
            const char *heap_name = NULL;

            switch (detect_result) {
            case ION_DETECT_IOMMU_DISABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            case ION_DETECT_IOMMU_ENABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_SYSTEM);
                ion_heap_id     = ION_HEAP_TYPE_SYSTEM;
                heap_name = "ION_HEAP_TYPE_SYSTEM";
            } break;
            case ION_DETECT_NO_DTS : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_CARVEOUT);
                ion_heap_id     = ION_HEAP_TYPE_CARVEOUT;
                heap_name = "ION_HEAP_TYPE_CARVEOUT";
            } break;
            default : {
                mpp_err("invalid detect result %d\n", detect_result);
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            }
            mpp_log("using ion heap %s\n", heap_name);
        }
        pthread_mutex_unlock(&lock);
        p->alignment    = alignment;
        p->flags        = flags;
        p->ion_device   = fd;
        *ctx = p;
    }

    return MPP_OK;
}